

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O1

void __thiscall compiler::EmissionContext::Declare(EmissionContext *this,string *var)

{
  size_type *psVar1;
  pointer pVVar2;
  undefined1 local_48 [8];
  VariableDeclaration vd;
  
  psVar1 = &vd.value._M_string_length;
  vd.value._M_dataplus._M_p = (pointer)0x0;
  vd.value._M_string_length._0_1_ = 0;
  local_48 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_assign((string *)local_48);
  vd.value.field_2._M_local_buf[8] = '\0';
  pVVar2 = (this->variables).
           super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this->firstFreeVariablesIndex <
      (ulong)(((long)(this->variables).
                     super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 3) *
             -0x3333333333333333)) {
    pVVar2 = pVVar2 + this->firstFreeVariablesIndex;
    std::__cxx11::string::_M_assign((string *)pVVar2);
    pVVar2->isFullyBound = (bool)vd.value.field_2._M_local_buf[8];
  }
  else {
    std::vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>::
    push_back(&this->variables,(value_type *)local_48);
  }
  this->firstFreeVariablesIndex = this->firstFreeVariablesIndex + 1;
  if (local_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_48,
                    CONCAT71(vd.value._M_string_length._1_7_,(undefined1)vd.value._M_string_length)
                    + 1);
  }
  return;
}

Assistant:

void Declare(const std::string & var) {
    VariableDeclaration vd;
    vd.value = var;
    vd.isFullyBound = false;

    if (this->firstFreeVariablesIndex < this->variables.size()) {
      this->variables.at(this->firstFreeVariablesIndex) = vd;
    } else {
      this->variables.push_back(vd);
    }
    this->firstFreeVariablesIndex++;
  }